

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_param_parse.cpp
# Opt level: O0

run_param * run_param_parse::parse(int argc,char **argv)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  run_param *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  double *pdVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e0;
  const_iterator local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c8;
  const_iterator local_6c0;
  undefined1 local_6b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest;
  volume_mapping vmp;
  undefined1 local_640 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string local_620;
  undefined1 local_600 [8];
  string volumes_map;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  string local_570;
  allocator local_549;
  string local_548;
  string local_528 [8];
  string memory_swap;
  allocator local_4e1;
  string local_4e0;
  string local_4c0 [8];
  string memory;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  run_param *local_428;
  run_param *argc_run_param;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  parser run;
  char **argv_local;
  int argc_local;
  
  run.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  cmdline::parser::parser((parser *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"interactive",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,"Keep STDIN open even if not attached",&local_129);
  cmdline::parser::add((parser *)local_d0,&local_f0,'i',&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"tty",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"Allocate a pseudo-TTY",&local_179);
  cmdline::parser::add((parser *)local_d0,&local_150,'t',&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"detach",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"Run container in background and print container ID",&local_1c9);
  cmdline::parser::add((parser *)local_d0,&local_1a0,'d',&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"memory",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"Memory limit",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"10m",&local_241);
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_d0,&local_1f0,'m',&local_218,false,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"memory-swap",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,
             "Swap limit equal to memory plus swap: \'-1\' to enable unlimited swap",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"10m",&local_2b9);
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_d0,&local_268,'\0',&local_290,false,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"name",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"Assign a name to the containe",&local_309);
  std::__cxx11::string::string((string *)&local_330);
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_d0,&local_2e0,'\0',&local_308,false,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"volume",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"Bind mount a volume",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"",&local_3a1);
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_d0,&local_350,'v',&local_378,false,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"cpus",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"Number of CPUs",&local_3f1);
  cmdline::parser::add<double>((parser *)local_d0,&local_3c8,'\0',&local_3f0,false,1.0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_418,"image [image args]",(allocator *)((long)&argc_run_param + 7));
  cmdline::parser::footer((parser *)local_d0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)((long)&argc_run_param + 7));
  cmdline::parser::parse_check
            ((parser *)local_d0,argc,
             (char **)run.errors.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  prVar3 = (run_param *)operator_new(0xb0);
  (prVar3->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(prVar3->name).field_2 + 8) = 0;
  *(undefined8 *)&prVar3->name = 0;
  (prVar3->name)._M_string_length = 0;
  (prVar3->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(prVar3->id).field_2 + 8) = 0;
  *(undefined8 *)&prVar3->id = 0;
  (prVar3->id)._M_string_length = 0;
  (prVar3->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (prVar3->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (prVar3->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (prVar3->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (prVar3->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (prVar3->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (prVar3->image).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(prVar3->image).field_2 + 8) = 0;
  *(undefined8 *)&prVar3->image = 0;
  (prVar3->image)._M_string_length = 0;
  *(undefined8 *)&prVar3->disk = 0;
  prVar3->cpus = 0.0;
  prVar3->super_param = run_param_type;
  prVar3->tty = false;
  prVar3->interactive = false;
  prVar3->detach = false;
  prVar3->field_0x7 = 0;
  prVar3->memory = 0;
  prVar3->memory_swap = 0;
  run_param::run_param(prVar3);
  local_428 = prVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"detach",&local_449);
  bVar1 = cmdline::parser::exist((parser *)local_d0,&local_448);
  local_428->detach = bVar1;
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"interactive",&local_471);
  bVar1 = cmdline::parser::exist((parser *)local_d0,&local_470);
  local_428->interactive = bVar1;
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_498,"tty",(allocator *)(memory.field_2._M_local_buf + 0xf));
  bVar1 = cmdline::parser::exist((parser *)local_d0,&local_498);
  local_428->tty = bVar1;
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)(memory.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"memory",&local_4e1);
  pbVar4 = cmdline::parser::get<std::__cxx11::string>((parser *)local_d0,&local_4e0);
  std::__cxx11::string::string(local_4c0,(string *)pbVar4);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::string((string *)(memory_swap.field_2._M_local_buf + 8),local_4c0);
  iVar2 = parse_utils::parse_memory((string *)((long)&memory_swap.field_2 + 8));
  local_428->memory = iVar2;
  std::__cxx11::string::~string((string *)(memory_swap.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_548,"memory-swap",&local_549);
  pbVar4 = cmdline::parser::get<std::__cxx11::string>((parser *)local_d0,&local_548);
  std::__cxx11::string::string(local_528,(string *)pbVar4);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::string((string *)&local_570,local_528);
  iVar2 = parse_utils::parse_memory(&local_570);
  local_428->memory_swap = iVar2;
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"cpus",&local_591);
  pdVar5 = cmdline::parser::get<double>((parser *)local_d0,&local_590);
  local_428->cpus = *pdVar5;
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"name",&local_5b9);
  pbVar4 = cmdline::parser::get<std::__cxx11::string>((parser *)local_d0,&local_5b8);
  std::__cxx11::string::operator=((string *)&local_428->name,(string *)pbVar4);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  uuid::generate_uuid_v4_abi_cxx11_();
  std::__cxx11::string::operator=
            ((string *)&local_428->id,(string *)(volumes_map.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(volumes_map.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_620,"volume",
             (allocator *)
             ((long)&opts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pbVar4 = cmdline::parser::get<std::__cxx11::string>((parser *)local_d0,&local_620);
  std::__cxx11::string::string((string *)local_600,(string *)pbVar4);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_600,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)(vmp.to.field_2._M_local_buf + 8),(string *)local_600);
    string_utils::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_640,(string *)((long)&vmp.to.field_2 + 8),':');
    std::__cxx11::string::~string((string *)(vmp.to.field_2._M_local_buf + 8));
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_640);
    if (sVar6 != 2) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               " please using \'-v /path/to/src:/path/to/target\'");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    this = &rest.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    volume_mapping::volume_mapping((volume_mapping *)this);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_640,0);
    std::__cxx11::string::operator=((string *)this,(string *)pvVar8);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_640,1);
    std::__cxx11::string::operator=((string *)(vmp.from.field_2._M_local_buf + 8),(string *)pvVar8);
    std::vector<volume_mapping,_std::allocator<volume_mapping>_>::push_back
              (&local_428->volumes,
               (value_type *)
               &rest.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    volume_mapping::~volume_mapping
              ((volume_mapping *)
               &rest.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_640);
  }
  __x = cmdline::parser::rest_abi_cxx11_((parser *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_6b8,__x);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8);
  if (sVar6 != 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b8,1);
    std::__cxx11::string::operator=((string *)&local_428->image,(string *)pvVar8);
    local_6c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_6c0,&local_6c8);
    local_6d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_6b8,local_6c0);
    local_6e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_6d8,&local_6e0);
    local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_6b8,local_6d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_428->exec,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b8);
    run_param::to_string_abi_cxx11_(&local_708,local_428);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_708);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_708);
    prVar3 = local_428;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6b8);
    std::__cxx11::string::~string((string *)local_600);
    std::__cxx11::string::~string(local_528);
    std::__cxx11::string::~string(local_4c0);
    cmdline::parser::~parser((parser *)local_d0);
    return prVar3;
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"you should add image name");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

run_param *run_param_parse::parse(int argc, char *argv[]) {
  cmdline::parser run;

  run.add("interactive", 'i', "Keep STDIN open even if not attached");
  run.add("tty", 't', "Allocate a pseudo-TTY");
  run.add("detach", 'd', "Run container in background and print container ID");

  run.add<string>("memory", 'm', "Memory limit", false, "10m");
  run.add<string>(
      "memory-swap", 0,
      "Swap limit equal to memory plus swap: '-1' to enable unlimited swap",
      false, "10m");

  run.add<string>("name", 0, "Assign a name to the containe", false);
  run.add<string>("volume", 'v', "Bind mount a volume", false, "");

  run.add<double>("cpus", 0, "Number of CPUs", false, 1);

  run.footer("image [image args]");

  run.parse_check(argc, argv);

  auto *argc_run_param = new run_param();

  argc_run_param->detach = run.exist("detach");
  argc_run_param->interactive = run.exist("interactive");
  argc_run_param->tty = run.exist("tty");

  // memory
  string memory = run.get<string>("memory");
  argc_run_param->memory = parse_utils::parse_memory(memory);

  // memory swap
  string memory_swap = run.get<string>("memory-swap");
  argc_run_param->memory_swap = parse_utils::parse_memory(memory_swap);

  // cpu
  argc_run_param->cpus = run.get<double>("cpus");

  // name
  argc_run_param->name = run.get<string>("name");

  // id
  argc_run_param->id = uuid::generate_uuid_v4();

  // volumn
  string volumes_map = run.get<string>("volume");
  if (volumes_map != "") {
    vector<string> opts = string_utils::split(volumes_map, ':');
    if (opts.size() != 2) {
      cerr << " please using '-v /path/to/src:/path/to/target'" << endl;
      exit(-1);
    } else {
      volume_mapping vmp;
      vmp.from = opts[0];
      vmp.to = opts[1];
      argc_run_param->volumes.push_back(vmp);
    }
  }

  vector<string> rest = run.rest();

  // rest[0] = 'run'
  if (rest.size() == 1) {
    cerr << "you should add image name" << endl;
    exit(-1);
  }
  argc_run_param->image = rest[1];

  rest.erase(rest.begin());
  rest.erase(rest.begin());
  argc_run_param->exec = rest;

  cout << argc_run_param->to_string() << endl;

  return argc_run_param;
}